

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void insert_to_b(bidx_t *b,int bin,uint64_t beg,uint64_t end)

{
  khint_t kVar1;
  hts_pair64_t *phVar2;
  int iVar3;
  bins_t *pbVar4;
  int absent;
  
  kVar1 = kh_put_bin(b,bin,&absent);
  pbVar4 = b->vals + kVar1;
  if (absent == 0) {
    iVar3 = pbVar4->n;
    if (iVar3 == pbVar4->m) {
      iVar3 = pbVar4->m * 2;
      pbVar4->m = iVar3;
      phVar2 = (hts_pair64_t *)realloc(pbVar4->list,(long)iVar3 << 4);
      pbVar4->list = phVar2;
      iVar3 = pbVar4->n;
      goto LAB_0010b7e4;
    }
  }
  else {
    pbVar4->m = 1;
    pbVar4->n = 0;
    phVar2 = (hts_pair64_t *)calloc(1,0x10);
    pbVar4->list = phVar2;
    iVar3 = 0;
  }
  phVar2 = pbVar4->list;
LAB_0010b7e4:
  phVar2[iVar3].u = beg;
  pbVar4->n = iVar3 + 1;
  phVar2[iVar3].v = end;
  return;
}

Assistant:

static inline void insert_to_b(bidx_t *b, int bin, uint64_t beg, uint64_t end)
{
    khint_t k;
    bins_t *l;
    int absent;
    k = kh_put(bin, b, bin, &absent);
    l = &kh_value(b, k);
    if (absent) {
        l->m = 1; l->n = 0;
        l->list = (hts_pair64_t*)calloc(l->m, sizeof(hts_pair64_t));
    }
    if (l->n == l->m) {
        l->m <<= 1;
        l->list = (hts_pair64_t*)realloc(l->list, l->m * sizeof(hts_pair64_t));
    }
    l->list[l->n].u = beg;
    l->list[l->n++].v = end;
}